

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMocker<ot::commissioner::State_()>::PerformDefaultAction
          (FunctionMocker<ot::commissioner::State_()> *this,ArgumentTuple *args,
          string *call_description)

{
  pointer pcVar1;
  Result RVar2;
  Result RVar3;
  OnCallSpec<ot::commissioner::State_()> *this_00;
  Action<ot::commissioner::State_()> *pAVar4;
  string message;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<ot::commissioner::State_()> *)0x0) {
    pAVar4 = OnCallSpec<ot::commissioner::State_()>::GetAction(this_00);
    RVar2 = Action<ot::commissioner::State_()>::Perform(pAVar4);
    return RVar2;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_30);
  if (DefaultValue<ot::commissioner::State>::producer_ == (long *)0x0) {
    RVar3 = kDisabled;
  }
  else {
    RVar3 = (**(code **)(*DefaultValue<ot::commissioner::State>::producer_ + 0x10))();
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return RVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }